

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType0.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::GridDataType0::Decode(GridDataType0 *this,KDataStream *stream)

{
  undefined1 *T;
  ushort uVar1;
  pointer puVar2;
  KUINT16 KVar3;
  KException *this_00;
  KUINT16 i;
  ushort uVar4;
  allocator<char> local_51;
  KUINT8 tmp;
  
  KVar3 = KDataStream::GetBufferSize(stream);
  if (5 < KVar3) {
    puVar2 = (this->m_vui8DataVals).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish != puVar2) {
      (this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar2;
    }
    GridData::Decode(&this->super_GridData,stream);
    T = &(this->super_GridData).field_0xc;
    KDataStream::Read<unsigned_short>(stream,(unsigned_short *)T);
    tmp = '\0';
    for (uVar4 = 0; uVar1 = *(ushort *)T, uVar4 < uVar1; uVar4 = uVar4 + 1) {
      KDataStream::Read(stream,&tmp);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (&this->m_vui8DataVals,&tmp);
    }
    if ((uVar1 & 1) != 0) {
      KDataStream::Read(stream,&this->m_ui8Padding);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&tmp,"Decode",&local_51);
  KException::KException(this_00,(KString *)&tmp,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void GridDataType0::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < GRID_DATA_TYPE0_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vui8DataVals.clear();

    GridData::Decode( stream );

    stream >> m_ui16NumBytes;

    KUINT8 tmp = 0;
    for( KUINT16 i = 0; i < m_ui16NumBytes; ++i )
    {
        stream >> tmp;
        m_vui8DataVals.push_back( tmp );
    }

    // Do we need to extract any padding?
    if( m_ui16NumBytes % 2 == 1 )
    {
        stream >> m_ui8Padding;
    }
}